

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartThreadSBGx(SBG *pSBG)

{
  int iVar1;
  long lVar2;
  THREAD_IDENTIFIER *pThreadId;
  CRITICAL_SECTION *pCriticalSection;
  
  pCriticalSection = SBGCS;
  pThreadId = SBGThreadId;
  lVar2 = 0;
  do {
    if (*(SBG **)((long)addrsSBG + lVar2 * 2) == pSBG) {
      *(undefined4 *)((long)resSBG + lVar2) = 1;
      *(undefined4 *)((long)bExitSBG + lVar2) = 0;
      memset(sbgdataSBG,0,0x11b0);
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(SBGThread,pSBG,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadSBGx(SBG* pSBG)
{
	int id = 0;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resSBG[id] = EXIT_FAILURE;
	bExitSBG[id] = FALSE;
	memset(&sbgdataSBG, 0, sizeof(SBGDATA));
	InitCriticalSection(&SBGCS[id]);
	return CreateDefaultThread(SBGThread, (void*)pSBG, &SBGThreadId[id]);
}